

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.h
# Opt level: O2

void Abstract<4U>::DistributeCheck
               (HashMap<4U> *mp,count_type HIT,HashMap<4U> *data2block,Abstract<4U> **sketches,
               vector<double,_std::allocator<double>_> *outs)

{
  int iVar1;
  pointer pdVar2;
  double dVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  mapped_type *pmVar8;
  int iVar9;
  int iVar10;
  __node_base *p_Var11;
  int iVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined8 in_XMM2_Qb;
  undefined1 auVar16 [16];
  undefined8 in_XMM3_Qb;
  undefined1 auVar17 [16];
  int local_4c;
  double local_48;
  
  p_Var11 = &(mp->_M_h)._M_before_begin;
  local_48 = 0.0;
  iVar10 = 0;
  local_4c = 0;
  iVar12 = 0;
  while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
    pmVar8 = std::__detail::
             _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)data2block,(key_type *)(p_Var11 + 1));
    iVar6 = (*sketches[*pmVar8]->_vptr_Abstract[3])(sketches[*pmVar8],p_Var11 + 1);
    iVar1 = *(int *)((long)(p_Var11 + 1) + 4);
    if (HIT < iVar1) {
      iVar12 = iVar12 + 1;
      iVar9 = -iVar6;
      if (0 < iVar6) {
        iVar9 = iVar6;
      }
      iVar6 = iVar9;
      if (HIT < iVar9) {
        local_4c = local_4c + 1;
        iVar9 = iVar1 - iVar9;
        iVar7 = -iVar9;
        if (0 < iVar9) {
          iVar7 = iVar9;
        }
        local_48 = local_48 + (double)iVar7 / (double)iVar1;
      }
    }
    iVar10 = iVar10 + (uint)(HIT < iVar6);
  }
  auVar13._0_8_ = (double)local_4c;
  auVar16._0_8_ = (double)iVar12;
  auVar16._8_8_ = in_XMM2_Qb;
  auVar17._0_8_ = (double)iVar10;
  auVar17._8_8_ = in_XMM3_Qb;
  auVar16 = vunpcklpd_avx(auVar16,auVar17);
  pdVar2 = (outs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar2 = local_48 / auVar13._0_8_;
  auVar13._8_8_ = auVar13._0_8_;
  auVar16 = vdivpd_avx(auVar13,auVar16);
  *(undefined1 (*) [16])(pdVar2 + 1) = auVar16;
  auVar13 = vshufpd_avx(auVar16,auVar16,1);
  dVar14 = auVar13._0_8_;
  dVar3 = dVar14 + auVar16._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar3;
  uVar4 = vcmpsd_avx512f(auVar15,ZEXT816(0x3eb0c6f7a0b5ed8d),1);
  bVar5 = (bool)((byte)uVar4 & 1);
  pdVar2[3] = ((dVar14 + dVar14) * auVar16._0_8_) /
              (double)((ulong)bVar5 * 0x3ff0000000000000 + (ulong)!bVar5 * (long)dVar3);
  return;
}

Assistant:

static void DistributeCheck(const HashMap<DATA_LEN>& mp, count_type HIT, HashMap<DATA_LEN>& data2block, Abstract<DATA_LEN>** sketches, std::vector<double>& outs)
	{
		typename HashMap<DATA_LEN>::const_iterator it;
		count_type value = 0, all = 0, hit = 0, size = 0, flagtrue = 0;
		double aae = 0, are = 0, cr = 0, pr = 0, rt = 0;
		for (it = mp.begin(); it != mp.end(); ++it) {
			int pos = data2block[it->first];
			value = sketches[pos]->QueryTopK(it->first);
			if (it->second > HIT) {
				all++;
				if (value < 0) {
					value = -value;
					flagtrue += 1;
				}
				if (value > HIT) {
					hit += 1;
					aae += abs(it->second - value);
					are += abs(it->second - value) / (double)it->second;
				}
			}
			if (value > HIT)
			{
				size += 1;
			}
		}

		aae /= hit;
		are /= hit;
		cr = hit / (double)all;
		pr = hit / (double)size;

		outs[0] = are;
		outs[1] = cr;
		outs[2] = pr;
		outs[3] = 2 * pr * cr / ((cr + pr < 1e-6) ? 1 : cr + pr);
	}